

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O3

double annAspectRatio(int dim,ANNorthRect *bnd_box)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = *bnd_box->hi - *bnd_box->lo;
  dVar4 = dVar2;
  if (0 < dim) {
    uVar1 = 0;
    dVar3 = dVar2;
    dVar5 = dVar2;
    do {
      dVar2 = bnd_box->hi[uVar1] - bnd_box->lo[uVar1];
      dVar4 = dVar2;
      if (dVar5 <= dVar2) {
        dVar4 = dVar5;
      }
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      uVar1 = uVar1 + 1;
      dVar3 = dVar2;
      dVar5 = dVar4;
    } while ((uint)dim != uVar1);
  }
  return dVar2 / dVar4;
}

Assistant:

double annAspectRatio(int dim,                     // dimension
                      const ANNorthRect &bnd_box)  // bounding cube
{
    ANNcoord length = bnd_box.hi[0] - bnd_box.lo[0];
    ANNcoord min_length = length;  // min side length
    ANNcoord max_length = length;  // max side length
    for (int d = 0; d < dim; d++) {
        length = bnd_box.hi[d] - bnd_box.lo[d];
        if (length < min_length) min_length = length;
        if (length > max_length) max_length = length;
    }
    return max_length / min_length;
}